

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

EqualLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_equal(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x32f) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x32f;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    EqualLayerParams::EqualLayerParams(this_00.equal_);
    (this->layer_).equal_ = (EqualLayerParams *)this_00;
  }
  return (EqualLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::EqualLayerParams* NeuralNetworkLayer::mutable_equal() {
  if (!has_equal()) {
    clear_layer();
    set_has_equal();
    layer_.equal_ = new ::CoreML::Specification::EqualLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.equal)
  return layer_.equal_;
}